

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_double_attr(attr_list l,atom_t attr_id,double *valp)

{
  int iVar1;
  double dVar2;
  attr_value_type t;
  attr_union v;
  attr_value_type local_1c;
  anon_union_16_6_0081cd67_for_u local_18;
  
  iVar1 = query_pattr(l,attr_id,&local_1c,(attr_union *)&local_18.o);
  if (iVar1 == 0) {
    return 0;
  }
  switch(local_1c) {
  case Attr_Int8:
    *valp = (double)CONCAT44(local_18.l._4_4_,local_18.i);
  case Attr_Int4:
    dVar2 = (double)local_18.i;
    break;
  default:
    return 0;
  case Attr_Float16:
    goto switchD_00105a0b_caseD_3;
  case Attr_Float8:
    dVar2 = (double)CONCAT44(local_18.l._4_4_,local_18.i);
    break;
  case Attr_Float4:
    dVar2 = (double)local_18.f;
  }
  *valp = dVar2;
switchD_00105a0b_caseD_3:
  return 1;
}

Assistant:

int
get_double_attr(attr_list l, atom_t attr_id, double *valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Int4:
	if (sizeof(int) == 4) *valp = v.u.i;
	*valp = v.u.i;
	break;
    case Attr_Int8:
	if (sizeof(ssize_t) == 8) *valp = (double) v.u.l;
	*valp = v.u.i;
	break;
    case Attr_Float16:
	if (sizeof(double) == 16) *valp = v.u.d;
	if (sizeof(float) == 16) *valp = v.u.f;
	break;
    case Attr_Float8:
	if (sizeof(double) == 8) *valp = v.u.d;
	if (sizeof(float) == 8) *valp = v.u.f;
	break;
    case Attr_Float4:
	if (sizeof(double) == 4) *valp = v.u.d;
	if (sizeof(float) == 4) *valp = v.u.f;
	break;
    default:
	return 0;
    }
    return 1;
}